

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O2

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,sunrealtype tol,int lr)

{
  int iVar1;
  void *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  long lVar2;
  long lVar3;
  int iVar4;
  
  flagvalue = (void *)N_VGetArrayPointer(r_vec);
  iVar1 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar4 = 1;
  if (iVar1 == 0) {
    flagvalue_00 = (void *)N_VGetArrayPointer(z_vec);
    iVar1 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar1 == 0) {
      flagvalue_01 = (void *)N_VGetArrayPointer(*(undefined8 *)((long)Data + 8));
      iVar1 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar1 == 0) {
        iVar4 = 0;
        lVar2 = *Data;
        if (*Data < 1) {
          lVar2 = 0;
        }
        for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
          *(double *)((long)flagvalue_00 + lVar3 * 8) =
               *(double *)((long)flagvalue + lVar3 * 8) /
               *(double *)((long)flagvalue_01 + lVar3 * 8);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, sunrealtype tol, int lr)
{
  /* local variables */
  sunrealtype *r, *z, *d;
  sunindextype i;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  r        = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate through domain, performing Jacobi solve */
  for (i = 0; i < ProbData->N; i++) { z[i] = r[i] / d[i]; }

  /* return with success */
  return 0;
}